

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap.h
# Opt level: O3

void __thiscall MeCab::Mmap<char>::~Mmap(Mmap<char> *this)

{
  pointer pcVar1;
  int in_ESI;
  
  this->_vptr_Mmap = (_func_int **)&PTR__Mmap_0019bf98;
  close(this,in_ESI);
  pcVar1 = (this->what_).str_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->what_).str_.field_2) {
    operator_delete(pcVar1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->what_);
  std::ios_base::~ios_base((ios_base *)&(this->what_).field_0x70);
  pcVar1 = (this->fileName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->fileName).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~Mmap() { this->close(); }